

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WebServer.cpp
# Opt level: O3

void __thiscall WebServer::run(WebServer *this)

{
  ThreadPool *this_00;
  pointer psVar1;
  undefined1 auVar2 [8];
  Task task;
  undefined1 local_d8 [8];
  pointer psStack_d0;
  _Head_base<0UL,_WebServer_*,_false> local_c8;
  pointer local_b8;
  pointer psStack_b0;
  _Tuple_impl<0UL,_WebServer_*,_std::_Placeholder<1>_> local_a8;
  _Any_data local_98;
  WebServer *local_88;
  undefined8 uStack_80;
  element_type *local_78;
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_70 [2];
  _Any_data local_60;
  code *local_50;
  element_type *local_40;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_38;
  
  local_b8 = (pointer)0x0;
  psStack_b0 = (pointer)0x0;
  local_a8.super__Head_base<0UL,_WebServer_*,_false>._M_head_impl =
       (_Head_base<0UL,_WebServer_*,_false>)(WebServer *)0x0;
  do {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"wait request",0xc);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18));
    std::ostream::put('\0');
    std::ostream::flush();
    handleEvents((vector<std::shared_ptr<HttpData>,_std::allocator<std::shared_ptr<HttpData>_>_> *)
                 local_d8,this);
    local_88 = (WebServer *)local_a8;
    local_98._8_8_ = psStack_b0;
    local_98._M_unused._M_object = local_b8;
    psVar1 = psStack_d0;
    auVar2 = local_d8;
    local_a8.super__Head_base<0UL,_WebServer_*,_false>._M_head_impl =
         (_Head_base<0UL,_WebServer_*,_false>)
         (_Head_base<0UL,_WebServer_*,_false>)local_c8._M_head_impl;
    local_b8 = (pointer)local_d8;
    psStack_b0 = psStack_d0;
    local_d8 = (undefined1  [8])0x0;
    psStack_d0 = (pointer)0x0;
    local_c8._M_head_impl = (WebServer *)0x0;
    std::vector<std::shared_ptr<HttpData>,_std::allocator<std::shared_ptr<HttpData>_>_>::~vector
              ((vector<std::shared_ptr<HttpData>,_std::allocator<std::shared_ptr<HttpData>_>_> *)
               &local_98);
    std::vector<std::shared_ptr<HttpData>,_std::allocator<std::shared_ptr<HttpData>_>_>::~vector
              ((vector<std::shared_ptr<HttpData>,_std::allocator<std::shared_ptr<HttpData>_>_> *)
               local_d8);
    for (; auVar2 != (undefined1  [8])psVar1; auVar2 = (undefined1  [8])((long)auVar2 + 0x10)) {
      local_78 = (element_type *)0x0;
      a_Stack_70[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_88 = (WebServer *)0x0;
      uStack_80 = 0;
      local_98._M_unused._M_object = (pointer)0x0;
      local_98._8_8_ = (pointer)0x0;
      local_d8 = (undefined1  [8])do_request;
      psStack_d0 = (pointer)0x0;
      local_c8._M_head_impl = this;
      std::function<void(std::shared_ptr<void>)>::operator=
                ((function<void(std::shared_ptr<void>)> *)local_98._M_pod_data,
                 (_Bind<void_(WebServer::*(WebServer_*,_std::_Placeholder<1>))(std::shared_ptr<void>)>
                  *)local_d8);
      local_78 = (((pointer)auVar2)->super___shared_ptr<HttpData,_(__gnu_cxx::_Lock_policy)2>).
                 _M_ptr;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                (a_Stack_70,
                 &(((pointer)auVar2)->super___shared_ptr<HttpData,_(__gnu_cxx::_Lock_policy)2>).
                  _M_refcount);
      this_00 = (this->threadPool_).super___shared_ptr<ThreadPool,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr;
      std::function<void_(std::shared_ptr<void>)>::function
                ((function<void_(std::shared_ptr<void>)> *)&local_60,
                 (function<void_(std::shared_ptr<void>)> *)&local_98);
      local_40 = local_78;
      local_38 = a_Stack_70[0]._M_pi;
      if (a_Stack_70[0]._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (a_Stack_70[0]._M_pi)->_M_use_count = (a_Stack_70[0]._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (a_Stack_70[0]._M_pi)->_M_use_count = (a_Stack_70[0]._M_pi)->_M_use_count + 1;
        }
      }
      ThreadPool::appendTask(this_00,(Task *)&local_60);
      if (local_38 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38);
      }
      if (local_50 != (code *)0x0) {
        (*local_50)(&local_60,&local_60,__destroy_functor);
      }
      if (a_Stack_70[0]._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(a_Stack_70[0]._M_pi);
      }
      if (local_88 != (WebServer *)0x0) {
        (*(code *)local_88)(&local_98,&local_98,3);
      }
    }
    TimerManager::tick(this->timerManager);
  } while( true );
}

Assistant:

void WebServer::run()
{

    std::vector<std::shared_ptr<HttpData>> epollInSocket;

    while (true)
    {
        std::cout << "wait request" << std::endl;

        epollInSocket = handleEvents();
        for (auto &it : epollInSocket)
        {
            Task task;
            task.function = std::bind(&WebServer::do_request, this, std::placeholders::_1);
            task.arg = it;
            threadPool_->appendTask(task);
        }
        /*每次处理完事件后就检查定时器*/
        timerManager->tick();
    }
}